

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::translateInternal
          (StructTranslator *this,MemberInfo *root,Builder builder)

{
  Which WVar1;
  MemberInfo *pMVar2;
  ErrorReporter *this_00;
  MemberInfo **ppMVar3;
  AuxNode *pAVar4;
  Exception *pEVar5;
  ArrayDisposer *pAVar6;
  Reader ordinal;
  Reader type;
  Reader type_00;
  Builder target;
  Builder target_00;
  Builder target_01;
  Reader type_01;
  Builder target_02;
  StructReader source;
  _Rb_tree_color _Var7;
  bool bVar8;
  uint uVar9;
  undefined4 uVar10;
  StructReader *pSVar11;
  _Base_ptr p_Var12;
  AuxNode *group;
  MemberInfo **ppMVar13;
  AuxNode *builder_00;
  char *pcVar14;
  NodeTranslator *pNVar15;
  NodeTranslator *pNVar16;
  StringPtr message;
  StringPtr message_00;
  StringPtr targetsFlagName;
  undefined8 uStackY_4f0;
  StringPtr local_448;
  BuilderArena *local_438;
  CapTableBuilder *pCStack_430;
  undefined8 local_428;
  ArrayPtr<const_char> local_418;
  SegmentBuilder *local_408;
  CapTableBuilder *pCStack_400;
  word *local_3f8;
  AuxNode *pAStack_3f0;
  ErrorReporter *local_3e8;
  MemberInfo *local_3e0;
  ImplicitParams *local_3d8;
  _Rb_tree_node_base *local_3d0;
  Builder typeBuilder;
  anon_class_8_1_60e67bd8 _kjContextFunc2163;
  undefined1 local_368 [40];
  Builder slot;
  word *local_318;
  word wStack_310;
  SegmentBuilder *local_308;
  CapTableBuilder *pCStack_300;
  word *local_2f8;
  AuxNode *pAStack_2f0;
  Fault f;
  ArrayDisposer *local_2d8;
  undefined1 local_250 [96];
  SegmentBuilder *pSStack_1f0;
  CapTableBuilder *local_1e8;
  word *pwStack_1e0;
  AuxNode *local_1d8;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRStack_1d0;
  Builder fieldBuilder;
  Builder structBuilder;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_node_translator_c__:2163:7)>
  _kjContext2163;
  StructReader local_128;
  StructReader local_f8;
  DuplicateOrdinalDetector dupDetector;
  undefined1 local_80 [80];
  
  local_3e0 = root;
  capnp::schema::Node::Builder::initStruct(&structBuilder,&builder);
  dupDetector.errorReporter = this->errorReporter;
  dupDetector.expectedOrdinal = 0;
  dupDetector.lastOrdinalLocation.ptr.isSet = false;
  p_Var12 = (this->membersByOrdinal)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3d0 = &(this->membersByOrdinal)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3d8 = &this->implicitMethodParams;
  do {
    if (p_Var12 == local_3d0) {
      MemberInfo::finishGroup(local_3e0);
      ppMVar13 = (this->allMembers).builder.ptr;
      ppMVar3 = (this->allMembers).builder.pos;
      do {
        if (ppMVar13 == ppMVar3) {
          *(short *)((long)structBuilder._builder.data + 0xe) =
               (short)(this->layout).top.dataWordCount;
          *(short *)((long)structBuilder._builder.data + 0x18) =
               (short)(this->layout).top.pointerCount;
          *(undefined2 *)((long)structBuilder._builder.data + 0x1a) = 7;
          pAVar4 = (this->translator->groups).builder.pos;
          for (builder_00 = (this->translator->groups).builder.ptr; builder_00 != pAVar4;
              builder_00 = builder_00 + 1) {
            capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
                      ((Builder *)&f,(OrphanBuilder *)builder_00);
            *(undefined2 *)((long)&local_2d8[1]._vptr_ArrayDisposer + 6) =
                 *(undefined2 *)((long)structBuilder._builder.data + 0xe);
            *(undefined4 *)&local_2d8[3]._vptr_ArrayDisposer =
                 *(undefined4 *)((long)structBuilder._builder.data + 0x18);
          }
          return;
        }
        pMVar2 = *ppMVar13;
        pcVar14 = "targetsParam";
        if (pMVar2->isParam == false) {
          WVar1 = pMVar2->declKind;
          pcVar14 = "targetsField";
          if (WVar1 != FIELD) {
            pcVar14 = "targetsUnion";
            if (WVar1 != UNION) {
              if (WVar1 != GROUP) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                          (&f,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                           ,0x8ef,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                           (char (*) [24])"Unexpected member type.");
                kj::_::Debug::Fault::fatal(&f);
              }
              pcVar14 = "targetsGroup";
            }
            MemberInfo::finishGroup(pMVar2);
          }
        }
        MemberInfo::getSchema((Builder *)&f,pMVar2);
        targetsFlagName.content.size_ = 0xd;
        targetsFlagName.content.ptr = pcVar14;
        compileAnnotationApplications
                  ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)
                   &_kjContext2163,this->translator,(Reader)(pMVar2->declAnnotations).reader,
                   targetsFlagName);
        capnp::schema::Field::Builder::adoptAnnotations
                  ((Builder *)&f,
                   (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)
                   &_kjContext2163);
        capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&_kjContext2163);
        ppMVar13 = ppMVar13 + 1;
      } while( true );
    }
    pMVar2 = (MemberInfo *)p_Var12[1]._M_parent;
    _kjContextFunc2163.member = pMVar2;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++:2163:7)>
    ::ContextImpl(&_kjContext2163,&_kjContextFunc2163);
    if ((0xf < (pMVar2->declId)._reader.dataSize) && (*(pMVar2->declId)._reader.data == 2)) {
      Declaration::Id::Reader::getOrdinal((Reader *)(local_250 + 0x58),&pMVar2->declId);
      ordinal._reader.capTable = (CapTableReader *)pSStack_1f0;
      ordinal._reader.segment = (SegmentReader *)local_250._88_8_;
      ordinal._reader.data = local_1e8;
      ordinal._reader.pointers = (WirePointer *)pwStack_1e0;
      ordinal._reader._32_8_ = local_1d8;
      ordinal._reader._40_8_ = pRStack_1d0;
      DuplicateOrdinalDetector::check(&dupDetector,ordinal);
    }
    MemberInfo::getSchema(&fieldBuilder,pMVar2);
    _Var7 = p_Var12[1]._M_color;
    *(undefined2 *)((long)fieldBuilder._builder.data + 10) = 1;
    *(short *)((long)fieldBuilder._builder.data + 0xc) = (short)_Var7;
    WVar1 = pMVar2->declKind;
    if (WVar1 != FIELD) {
      if (WVar1 != UNION) {
        if (WVar1 != GROUP) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x8d2,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                     (char (*) [24])"Unexpected member type.");
          kj::_::Debug::Fault::fatal(&f);
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x8ce,FAILED,(char *)0x0,"\"Groups don\'t have ordinals.\"",
                   (char (*) [28])"Groups don\'t have ordinals.");
        kj::_::Debug::Fault::fatal(&f);
      }
      bVar8 = StructLayout::Union::addDiscriminant((pMVar2->field_21).unionScope);
      if (!bVar8) {
        this_00 = this->errorReporter;
        Declaration::Id::Reader::getOrdinal((Reader *)&f,&pMVar2->declId);
        message.content.size_ = 0x96;
        message.content.ptr =
             "Union ordinal, if specified, must be greater than no more than one of its member ordinals (i.e. there can only be one field retroactively unionized)."
        ;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader>
                  (this_00,(Reader *)&f,message);
      }
      goto LAB_004700ca;
    }
    capnp::schema::Field::Builder::initSlot(&slot,&fieldBuilder);
    capnp::schema::Field::Slot::Builder::initType(&typeBuilder,&slot);
    target._builder.capTable = typeBuilder._builder.capTable;
    target._builder.segment = typeBuilder._builder.segment;
    target._builder.data = typeBuilder._builder.data;
    target._builder.pointers = typeBuilder._builder.pointers;
    target._builder.dataSize = typeBuilder._builder.dataSize;
    target._builder.pointerCount = typeBuilder._builder.pointerCount;
    target._builder._38_2_ = typeBuilder._builder._38_2_;
    bVar8 = compileType(this->translator,(Reader)(pMVar2->fieldType)._reader,target,*local_3d8);
    if (bVar8) {
      if (pMVar2->hasDefaultValue != true) {
        capnp::_::StructBuilder::asReader(&typeBuilder._builder);
        pNVar16 = (NodeTranslator *)(local_80 + 0x28);
        pNVar15 = pNVar16;
        capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)pNVar16,&slot);
        pSVar11 = &local_f8;
        goto LAB_0046fdb1;
      }
      if (((pMVar2->isParam == true) && (0xf < (pMVar2->fieldDefaultValue)._reader.dataSize)) &&
         (*(pMVar2->fieldDefaultValue)._reader.data == 5)) {
        Expression::Reader::getRelativeName((Reader *)&f,&pMVar2->fieldDefaultValue);
        local_418 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&f);
        local_448.content.ptr = "null";
        local_448.content.size_ = 5;
        bVar8 = kj::StringPtr::operator==((StringPtr *)&local_418,&local_448);
        if (!bVar8) goto LAB_0046fdf0;
        if ((0x12 < *typeBuilder._builder.data) ||
           ((0x77000U >> (*typeBuilder._builder.data & 0x1f) & 1) == 0)) {
          local_3e8 = this->errorReporter;
          Expression::Reader::getRelativeName((Reader *)&f,&pMVar2->fieldDefaultValue);
          message_00.content.size_ = 0x3d;
          message_00.content.ptr = "Only pointer parameters can declare their default as \'null\'.";
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader>
                    (local_3e8,(Reader *)&f,message_00);
        }
        capnp::_::StructBuilder::asReader(&typeBuilder._builder);
        pNVar16 = (NodeTranslator *)local_250;
        capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)pNVar16,&slot);
        type._reader.capTable = (CapTableReader *)local_250._48_8_;
        type._reader.segment = (SegmentReader *)local_250._40_8_;
        type._reader.data = (void *)local_250._56_8_;
        type._reader.pointers = (WirePointer *)local_250._64_8_;
        type._reader.dataSize = local_250._72_4_;
        type._reader.pointerCount = local_250._76_2_;
        type._reader._38_2_ = local_250._78_2_;
        type._reader._40_8_ = local_250._80_8_;
        target_00._builder.capTable = (CapTableBuilder *)local_250._8_8_;
        target_00._builder.segment = (SegmentBuilder *)local_250._0_8_;
        target_00._builder.data = (void *)local_250._16_8_;
        target_00._builder.pointers = (WirePointer *)local_250._24_8_;
        target_00._builder.dataSize = local_250._32_4_;
        target_00._builder.pointerCount = local_250._36_2_;
        target_00._builder._38_2_ = local_250._38_2_;
        compileDefaultDefaultValue(pNVar16,type,target_00);
      }
      else {
LAB_0046fdf0:
        pNVar15 = this->translator;
        pEVar5 = (Exception *)(pMVar2->fieldDefaultValue)._reader.segment;
        pAVar6 = (ArrayDisposer *)(pMVar2->fieldDefaultValue)._reader.data;
        source = (pMVar2->fieldDefaultValue)._reader;
        capnp::_::StructBuilder::asReader(&typeBuilder._builder);
        pNVar16 = (NodeTranslator *)local_368;
        capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)pNVar16,&slot);
        local_428 = local_368._32_8_;
        local_438 = (BuilderArena *)local_368._16_8_;
        pCStack_430 = (CapTableBuilder *)local_368._24_8_;
        local_448.content.ptr = (char *)local_368._0_8_;
        local_448.content.size_ = local_368._8_8_;
        local_418.size_ = wStack_310.content;
        local_418.ptr = (char *)local_318;
        local_408 = local_308;
        pCStack_400 = pCStack_300;
        local_3f8 = local_2f8;
        pAStack_3f0 = pAStack_2f0;
        type_00._reader.capTable = (CapTableReader *)wStack_310.content;
        type_00._reader.segment = (SegmentReader *)local_318;
        type_00._reader.data = local_308;
        type_00._reader.pointers = (WirePointer *)pCStack_300;
        type_00._reader._32_8_ = local_2f8;
        type_00._reader._40_8_ = pAStack_2f0;
        target_01._builder.capTable = (CapTableBuilder *)local_368._8_8_;
        target_01._builder.segment = (SegmentBuilder *)local_368._0_8_;
        target_01._builder.data = (void *)local_368._16_8_;
        target_01._builder.pointers = (WirePointer *)local_368._24_8_;
        target_01._builder.dataSize = local_368._32_4_;
        target_01._builder.pointerCount = local_368._36_2_;
        target_01._builder._38_2_ = local_368._38_2_;
        compileDefaultDefaultValue(pNVar16,type_00,target_01);
        if ((((uint)local_3f8 < 0x10) ||
            (uVar9 = (uint)*(ushort *)&(local_408->super_SegmentReader).arena, 0x12 < uVar9)) ||
           ((0x74000U >> (uVar9 & 0x1f) & 1) == 0)) {
          type_01._reader.data = local_408;
          type_01._reader.segment = (SegmentReader *)local_418.ptr;
          type_01._reader.capTable = (CapTableReader *)local_418.size_;
          type_01._reader.pointers = (WirePointer *)pCStack_400;
          type_01._reader._32_8_ = local_3f8;
          type_01._reader._40_8_ = pAStack_3f0;
          target_02._builder.capTable = (CapTableBuilder *)local_448.content.size_;
          target_02._builder.segment = (SegmentBuilder *)local_448.content.ptr;
          target_02._builder.data = local_438;
          target_02._builder.pointers = (WirePointer *)pCStack_430;
          target_02._builder._32_8_ = local_428;
          compileValue(pNVar15,(Reader)source,type_01,(Schema)0x674d40,target_02,true);
        }
        else {
          f.exception = pEVar5;
          kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::
          add<capnp::compiler::NodeTranslator::UnfinishedValue>
                    (&pNVar15->unfinishedValues,(UnfinishedValue *)&f);
          local_2d8 = pAVar6;
        }
      }
      *(byte *)((long)slot._builder.data + 0x10) = *(byte *)((long)slot._builder.data + 0x10) | 1;
    }
    else {
      capnp::_::StructBuilder::asReader(&typeBuilder._builder);
      pNVar16 = (NodeTranslator *)local_80;
      pNVar15 = pNVar16;
      capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)pNVar16,&slot);
      pSVar11 = &local_128;
LAB_0046fdb1:
      compileDefaultDefaultValue(pNVar15,(Reader)*pSVar11,(Builder)*(StructBuilder *)pNVar16);
    }
    switch(*typeBuilder._builder.data) {
    case 1:
      uStackY_4f0 = 0;
      break;
    case 2:
    case 6:
      uStackY_4f0 = 3;
      break;
    case 3:
    case 7:
    case 0xf:
      uStackY_4f0 = 4;
      break;
    case 4:
    case 8:
    case 10:
      uStackY_4f0 = 5;
      break;
    case 5:
    case 9:
    case 0xb:
      uStackY_4f0 = 6;
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x12:
      uVar10 = (*(code *)((pMVar2->field_21).unionScope)->parent[2]._vptr_StructOrGroup)();
      goto LAB_004700bf;
    default:
      uVar10 = 0;
      (*(code *)((pMVar2->field_21).unionScope)->parent->_vptr_StructOrGroup)();
      goto LAB_004700bf;
    }
    uVar10 = (*(code *)((pMVar2->field_21).unionScope)->parent[1]._vptr_StructOrGroup)
                       ((pMVar2->field_21).unionScope,uStackY_4f0);
LAB_004700bf:
    *(undefined4 *)((long)slot._builder.data + 4) = uVar10;
LAB_004700ca:
    kj::_::Debug::Context::~Context(&_kjContext2163.super_Context);
    p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
  } while( true );
}

Assistant:

void translateInternal(MemberInfo& root, schema::Node::Builder builder) {
    auto structBuilder = builder.initStruct();

    // Go through each member in ordinal order, building each member schema.
    DuplicateOrdinalDetector dupDetector(errorReporter);
    for (auto& entry: membersByOrdinal) {
      MemberInfo& member = *entry.second;

      // Make sure the exceptions added relating to
      // https://github.com/sandstorm-io/capnproto/issues/344 identify the affected field.
      KJ_CONTEXT(member.name);

      if (member.declId.isOrdinal()) {
        dupDetector.check(member.declId.getOrdinal());
      }

      schema::Field::Builder fieldBuilder = member.getSchema();
      fieldBuilder.getOrdinal().setExplicit(entry.first);

      switch (member.declKind) {
        case Declaration::FIELD: {
          auto slot = fieldBuilder.initSlot();
          auto typeBuilder = slot.initType();
          if (translator.compileType(member.fieldType, typeBuilder, implicitMethodParams)) {
            if (member.hasDefaultValue) {
              if (member.isParam &&
                  member.fieldDefaultValue.isRelativeName() &&
                  member.fieldDefaultValue.getRelativeName().getValue() == "null") {
                // special case: parameter set null
                switch (typeBuilder.which()) {
                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::LIST:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::ANY_POINTER:
                    break;
                  default:
                    errorReporter.addErrorOn(member.fieldDefaultValue.getRelativeName(),
                        "Only pointer parameters can declare their default as 'null'.");
                    break;
                }
                translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
              } else {
                translator.compileBootstrapValue(member.fieldDefaultValue,
                                                 typeBuilder, slot.initDefaultValue());
              }
              slot.setHadExplicitDefault(true);
            } else {
              translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
            }
          } else {
            translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
          }

          int lgSize = -1;
          switch (typeBuilder.which()) {
            case schema::Type::VOID: lgSize = -1; break;
            case schema::Type::BOOL: lgSize = 0; break;
            case schema::Type::INT8: lgSize = 3; break;
            case schema::Type::INT16: lgSize = 4; break;
            case schema::Type::INT32: lgSize = 5; break;
            case schema::Type::INT64: lgSize = 6; break;
            case schema::Type::UINT8: lgSize = 3; break;
            case schema::Type::UINT16: lgSize = 4; break;
            case schema::Type::UINT32: lgSize = 5; break;
            case schema::Type::UINT64: lgSize = 6; break;
            case schema::Type::FLOAT32: lgSize = 5; break;
            case schema::Type::FLOAT64: lgSize = 6; break;

            case schema::Type::TEXT: lgSize = -2; break;
            case schema::Type::DATA: lgSize = -2; break;
            case schema::Type::LIST: lgSize = -2; break;
            case schema::Type::ENUM: lgSize = 4; break;
            case schema::Type::STRUCT: lgSize = -2; break;
            case schema::Type::INTERFACE: lgSize = -2; break;
            case schema::Type::ANY_POINTER: lgSize = -2; break;
          }

          if (lgSize == -2) {
            // pointer
            slot.setOffset(member.fieldScope->addPointer());
          } else if (lgSize == -1) {
            // void
            member.fieldScope->addVoid();
            slot.setOffset(0);
          } else {
            slot.setOffset(member.fieldScope->addData(lgSize));
          }
          break;
        }

        case Declaration::UNION:
          if (!member.unionScope->addDiscriminant()) {
            errorReporter.addErrorOn(member.declId.getOrdinal(),
                "Union ordinal, if specified, must be greater than no more than one of its "
                "member ordinals (i.e. there can only be one field retroactively unionized).");
          }
          break;

        case Declaration::GROUP:
          KJ_FAIL_ASSERT("Groups don't have ordinals.");
          break;

        default:
          KJ_FAIL_ASSERT("Unexpected member type.");
          break;
      }
    }

    // OK, we should have built all the members.  Now go through and make sure the discriminant
    // offsets have been copied over to the schemas and annotations have been applied.
    root.finishGroup();
    for (auto member: allMembers) {
      kj::StringPtr targetsFlagName;
      if (member->isParam) {
        targetsFlagName = "targetsParam";
      } else {
        switch (member->declKind) {
          case Declaration::FIELD:
            targetsFlagName = "targetsField";
            break;

          case Declaration::UNION:
            member->finishGroup();
            targetsFlagName = "targetsUnion";
            break;

          case Declaration::GROUP:
            member->finishGroup();
            targetsFlagName = "targetsGroup";
            break;

          default:
            KJ_FAIL_ASSERT("Unexpected member type.");
            break;
        }
      }

      member->getSchema().adoptAnnotations(translator.compileAnnotationApplications(
          member->declAnnotations, targetsFlagName));
    }

    // And fill in the sizes.
    structBuilder.setDataWordCount(layout.getTop().dataWordCount);
    structBuilder.setPointerCount(layout.getTop().pointerCount);
    structBuilder.setPreferredListEncoding(schema::ElementSize::INLINE_COMPOSITE);

    for (auto& group: translator.groups) {
      auto groupBuilder = group.node.get().getStruct();
      groupBuilder.setDataWordCount(structBuilder.getDataWordCount());
      groupBuilder.setPointerCount(structBuilder.getPointerCount());
      groupBuilder.setPreferredListEncoding(structBuilder.getPreferredListEncoding());
    }
  }